

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O1

void * TrainModelThread(void *id)

{
  char cVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  longlong lVar5;
  vocab_word *pvVar6;
  real *prVar7;
  real *prVar8;
  real *prVar9;
  real *prVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  void *__ptr;
  void *__ptr_00;
  FILE *__stream;
  long lVar14;
  clock_t cVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  void *pvVar27;
  float fVar28;
  float fVar29;
  double dVar30;
  longlong sen [1001];
  long local_2008;
  long local_1ff8;
  long local_1fe0;
  longlong local_1fc0;
  long alStack_1f78 [1001];
  
  lVar5 = layer1_size;
  local_1fc0 = iter;
  __ptr = calloc(layer1_size,4);
  __ptr_00 = calloc(lVar5,4);
  printf("Opening train file %s\n",train_file);
  __stream = fopen(train_file,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"no such file or directory: %s",train_file);
    exit(1);
  }
  pvVar27 = id;
  if ((long)num_threads < 2) {
    local_2008 = 0;
    goto LAB_00103580;
  }
  lVar14 = file_size / (long)num_threads;
  local_2008 = 0;
LAB_0010356d:
  fseek(__stream,lVar14 * (long)id,0);
LAB_00103580:
  lVar14 = 0;
  local_1fe0 = 0;
  local_1ff8 = 0;
  do {
    if (10000 < lVar14 - local_1fe0) {
      word_count_actual = word_count_actual + (lVar14 - local_1fe0);
      if (1 < debug_mode) {
        cVar15 = clock();
        printf("%cAlpha: %f  Progress: %.2f%%  Words/thread/sec: %.2fk  ",(double)alpha,
               (double)(((float)word_count_actual / (float)(train_words * iter + 1)) * 100.0),
               (double)((float)word_count_actual /
                       (((float)((cVar15 - start) + 1) / 1e+06) * 1000.0)));
        fflush(_stdout);
      }
      alpha = (1.0 - (float)word_count_actual / (float)(train_words * iter + 1)) * starting_alpha;
      local_1fe0 = lVar14;
      if (alpha < starting_alpha * 0.0001) {
        alpha = starting_alpha * 0.0001;
      }
    }
    if (local_1ff8 == 0) {
      local_1ff8 = 0;
      lVar18 = local_1ff8;
LAB_001036e2:
      do {
        do {
          local_1ff8 = lVar18;
          iVar11 = ReadWordIndex((FILE *)__stream);
          iVar12 = feof(__stream);
          if (iVar12 != 0) {
LAB_00103810:
            local_2008 = 0;
            goto LAB_00103820;
          }
          lVar18 = local_1ff8;
        } while (iVar11 == -1);
        lVar14 = lVar14 + 1;
        if (iVar11 == 0) goto LAB_00103810;
        lVar20 = (long)iVar11;
        if (0.0 < sample) {
          dVar30 = (double)((float)vocab[lVar20].cn / (sample * (float)train_words));
          if (dVar30 < 0.0) {
            dVar30 = sqrt(dVar30);
          }
          else {
            dVar30 = SQRT(dVar30);
          }
          pvVar27 = (void *)((long)pvVar27 * 0x5deece66d + 0xb);
          if ((float)(((double)((float)train_words * sample) * (dVar30 + 1.0)) /
                     (double)vocab[lVar20].cn) < (float)((uint)pvVar27 & 0xffff) * 1.5258789e-05)
          goto LAB_001036e2;
        }
        alStack_1f78[local_1ff8] = lVar20;
        lVar18 = local_1ff8 + 1;
        local_1ff8 = 1000;
        local_2008 = 0;
      } while (lVar18 != 1000);
    }
LAB_00103820:
    iVar11 = feof(__stream);
    lVar5 = layer1_size;
    if ((iVar11 != 0) || (train_words / (long)num_threads < lVar14)) break;
    lVar18 = alStack_1f78[local_2008];
    if (lVar18 != -1) {
      if (0 < layer1_size) {
        memset(__ptr,0,layer1_size * 4);
        memset(__ptr_00,0,lVar5 * 4);
      }
      prVar7 = syn0;
      pvVar6 = vocab;
      iVar12 = hs;
      iVar11 = negative;
      pvVar27 = (void *)((long)pvVar27 * 0x5deece66d + 0xb);
      uVar23 = (ulong)window;
      uVar19 = (ulong)pvVar27 % uVar23;
      lVar20 = (uVar23 * 2 + 1) - uVar19;
      if (cbow == 0) {
        if ((long)uVar19 < lVar20) {
          uVar13 = negative + 1;
          do {
            if ((((uVar19 != uVar23) && (lVar16 = uVar19 + (local_2008 - uVar23), -1 < lVar16)) &&
                (lVar16 < local_1ff8)) && (lVar16 = alStack_1f78[lVar16], lVar16 != -1)) {
              if (0 < lVar5) {
                memset(__ptr_00,0,lVar5 * 4);
              }
              prVar10 = expTable;
              prVar9 = syn1;
              prVar8 = syn0;
              lVar16 = lVar16 * lVar5;
              if ((iVar12 != 0) && (cVar1 = pvVar6[lVar18].codelen, 0 < (long)cVar1)) {
                piVar2 = pvVar6[lVar18].point;
                lVar22 = 0;
                do {
                  lVar24 = piVar2[lVar22] * lVar5;
                  fVar28 = 0.0;
                  if (0 < lVar5) {
                    lVar26 = 0;
                    do {
                      fVar28 = fVar28 + prVar8[lVar16 + lVar26] * prVar9[lVar24 + lVar26];
                      lVar26 = lVar26 + 1;
                    } while (lVar5 != lVar26);
                  }
                  if (ABS(fVar28) < 6.0) {
                    fVar28 = ((float)(1 - pvVar6[lVar18].code[lVar22]) -
                             prVar10[(int)((fVar28 + 6.0) * 83.0)]) * alpha;
                    if (0 < lVar5) {
                      lVar26 = 0;
                      do {
                        *(float *)((long)__ptr_00 + lVar26 * 4) =
                             prVar9[lVar24 + lVar26] * fVar28 +
                             *(float *)((long)__ptr_00 + lVar26 * 4);
                        lVar26 = lVar26 + 1;
                      } while (lVar5 != lVar26);
                    }
                    if (0 < lVar5) {
                      lVar26 = 0;
                      do {
                        prVar9[lVar24 + lVar26] =
                             prVar8[lVar16 + lVar26] * fVar28 + prVar9[lVar24 + lVar26];
                        lVar26 = lVar26 + 1;
                      } while (lVar5 != lVar26);
                    }
                  }
                  lVar22 = lVar22 + 1;
                } while (lVar22 != cVar1);
              }
              prVar10 = expTable;
              prVar9 = syn1neg;
              prVar8 = syn0;
              piVar2 = table;
              if (0 < iVar11) {
                uVar21 = vocab_size - 1;
                uVar25 = 0;
                do {
                  if (uVar25 == 0) {
                    iVar17 = 1;
                    lVar22 = lVar18;
LAB_00103c70:
                    lVar22 = lVar22 * lVar5;
                    fVar28 = 0.0;
                    if (0 < lVar5) {
                      lVar24 = 0;
                      do {
                        fVar28 = fVar28 + prVar8[lVar16 + lVar24] * prVar9[lVar22 + lVar24];
                        lVar24 = lVar24 + 1;
                      } while (lVar5 != lVar24);
                    }
                    if (fVar28 <= 6.0) {
                      fVar29 = (float)iVar17;
                      if (-6.0 <= fVar28) {
                        fVar29 = fVar29 - prVar10[(int)((fVar28 + 6.0) * 83.0)];
                      }
                    }
                    else {
                      fVar29 = (float)(iVar17 + -1);
                    }
                    fVar29 = fVar29 * alpha;
                    if (0 < lVar5) {
                      lVar24 = 0;
                      do {
                        *(float *)((long)__ptr_00 + lVar24 * 4) =
                             prVar9[lVar22 + lVar24] * fVar29 +
                             *(float *)((long)__ptr_00 + lVar24 * 4);
                        lVar24 = lVar24 + 1;
                      } while (lVar5 != lVar24);
                    }
                    if (0 < lVar5) {
                      lVar24 = 0;
                      do {
                        prVar9[lVar22 + lVar24] =
                             prVar8[lVar16 + lVar24] * fVar29 + prVar9[lVar22 + lVar24];
                        lVar24 = lVar24 + 1;
                      } while (lVar5 != lVar24);
                    }
                  }
                  else {
                    pvVar27 = (void *)((long)pvVar27 * 0x5deece66d + 0xb);
                    auVar3._8_8_ = 0;
                    auVar3._0_8_ = (ulong)pvVar27 >> 0x10;
                    lVar22 = (long)piVar2[(int)((ulong)pvVar27 >> 0x10) +
                                          (SUB164(auVar3 * ZEXT816(0x55e63b88c231),8) >> 9) *
                                          -100000000];
                    if (lVar22 == 0) {
                      lVar22 = (ulong)pvVar27 % uVar21 + 1;
                    }
                    if (lVar22 != lVar18) {
                      iVar17 = 0;
                      goto LAB_00103c70;
                    }
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar25 != uVar13);
              }
              if (0 < lVar5) {
                lVar22 = 0;
                do {
                  prVar7[lVar16 + lVar22] =
                       *(float *)((long)__ptr_00 + lVar22 * 4) + prVar7[lVar16 + lVar22];
                  lVar22 = lVar22 + 1;
                } while (lVar5 != lVar22);
              }
            }
            uVar19 = uVar19 + 1;
          } while ((long)uVar19 < lVar20);
        }
      }
      else {
        if ((long)uVar19 < lVar20) {
          lVar16 = 0;
          uVar21 = uVar19;
          do {
            if (((uVar21 != uVar23) && (lVar22 = uVar21 + (local_2008 - uVar23), -1 < lVar22)) &&
               ((lVar22 < local_1ff8 && (lVar22 = alStack_1f78[lVar22], lVar22 != -1)))) {
              if (0 < lVar5) {
                lVar24 = 0;
                do {
                  *(float *)((long)__ptr + lVar24 * 4) =
                       prVar7[lVar22 * lVar5 + lVar24] + *(float *)((long)__ptr + lVar24 * 4);
                  lVar24 = lVar24 + 1;
                } while (lVar5 != lVar24);
              }
              lVar16 = lVar16 + 1;
            }
            uVar21 = uVar21 + 1;
          } while ((long)uVar21 < lVar20);
        }
        else {
          lVar16 = 0;
        }
        if (lVar16 != 0) {
          if (0 < lVar5) {
            lVar22 = 0;
            do {
              *(float *)((long)__ptr + lVar22 * 4) =
                   *(float *)((long)__ptr + lVar22 * 4) / (float)lVar16;
              lVar22 = lVar22 + 1;
            } while (lVar5 != lVar22);
          }
          prVar8 = expTable;
          prVar7 = syn1;
          pvVar6 = vocab;
          if ((hs != 0) && (cVar1 = vocab[lVar18].codelen, 0 < (long)cVar1)) {
            piVar2 = vocab[lVar18].point;
            lVar16 = 0;
            do {
              lVar22 = piVar2[lVar16] * lVar5;
              fVar28 = 0.0;
              if (0 < lVar5) {
                lVar24 = 0;
                do {
                  fVar28 = fVar28 + *(float *)((long)__ptr + lVar24 * 4) * prVar7[lVar22 + lVar24];
                  lVar24 = lVar24 + 1;
                } while (lVar5 != lVar24);
              }
              if (ABS(fVar28) < 6.0) {
                fVar28 = ((float)(1 - pvVar6[lVar18].code[lVar16]) -
                         prVar8[(int)((fVar28 + 6.0) * 83.0)]) * alpha;
                if (0 < lVar5) {
                  lVar24 = 0;
                  do {
                    *(float *)((long)__ptr_00 + lVar24 * 4) =
                         prVar7[lVar22 + lVar24] * fVar28 + *(float *)((long)__ptr_00 + lVar24 * 4);
                    lVar24 = lVar24 + 1;
                  } while (lVar5 != lVar24);
                }
                if (0 < lVar5) {
                  lVar24 = 0;
                  do {
                    prVar7[lVar22 + lVar24] =
                         *(float *)((long)__ptr + lVar24 * 4) * fVar28 + prVar7[lVar22 + lVar24];
                    lVar24 = lVar24 + 1;
                  } while (lVar5 != lVar24);
                }
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != cVar1);
          }
          prVar8 = expTable;
          prVar7 = syn1neg;
          piVar2 = table;
          uVar21 = (ulong)(uint)negative;
          if (0 < negative) {
            uVar25 = vocab_size - 1;
            lVar16 = 0;
            do {
              if (lVar16 == 0) {
                iVar11 = 1;
                lVar22 = lVar18;
LAB_00103f65:
                lVar22 = lVar22 * lVar5;
                fVar28 = 0.0;
                if (0 < lVar5) {
                  lVar24 = 0;
                  do {
                    fVar28 = fVar28 + *(float *)((long)__ptr + lVar24 * 4) * prVar7[lVar22 + lVar24]
                    ;
                    lVar24 = lVar24 + 1;
                  } while (lVar5 != lVar24);
                }
                if (fVar28 <= 6.0) {
                  fVar29 = (float)iVar11;
                  if (-6.0 <= fVar28) {
                    fVar29 = fVar29 - prVar8[(int)((fVar28 + 6.0) * 83.0)];
                  }
                }
                else {
                  fVar29 = (float)(iVar11 + -1);
                }
                fVar29 = fVar29 * alpha;
                if (0 < lVar5) {
                  lVar24 = 0;
                  do {
                    *(float *)((long)__ptr_00 + lVar24 * 4) =
                         prVar7[lVar22 + lVar24] * fVar29 + *(float *)((long)__ptr_00 + lVar24 * 4);
                    lVar24 = lVar24 + 1;
                  } while (lVar5 != lVar24);
                }
                if (0 < lVar5) {
                  lVar24 = 0;
                  do {
                    prVar7[lVar22 + lVar24] =
                         *(float *)((long)__ptr + lVar24 * 4) * fVar29 + prVar7[lVar22 + lVar24];
                    lVar24 = lVar24 + 1;
                  } while (lVar5 != lVar24);
                }
              }
              else {
                pvVar27 = (void *)((long)pvVar27 * 0x5deece66d + 0xb);
                auVar4._8_8_ = 0;
                auVar4._0_8_ = (ulong)pvVar27 >> 0x10;
                lVar22 = (long)piVar2[(int)((ulong)pvVar27 >> 0x10) +
                                      (SUB164(auVar4 * ZEXT816(0x55e63b88c231),8) >> 9) * -100000000
                                     ];
                if (lVar22 == 0) {
                  lVar22 = (ulong)pvVar27 % uVar25 + 1;
                }
                if (lVar22 != lVar18) {
                  iVar11 = 0;
                  goto LAB_00103f65;
                }
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != uVar21 + 1);
          }
          prVar7 = syn0;
          if ((long)uVar19 < lVar20) {
            do {
              if ((((uVar19 != uVar23) && (lVar18 = uVar19 + (local_2008 - uVar23), -1 < lVar18)) &&
                  (lVar18 < local_1ff8)) && (alStack_1f78[lVar18] != -1 && 0 < lVar5)) {
                lVar18 = alStack_1f78[lVar18] * lVar5;
                lVar16 = 0;
                do {
                  prVar7[lVar18 + lVar16] =
                       *(float *)((long)__ptr_00 + lVar16 * 4) + prVar7[lVar18 + lVar16];
                  lVar16 = lVar16 + 1;
                } while (lVar5 != lVar16);
              }
              uVar19 = uVar19 + 1;
            } while ((long)uVar19 < lVar20);
          }
        }
      }
      local_2008 = local_2008 + 1;
      if (local_1ff8 <= local_2008) {
        local_1ff8 = 0;
      }
    }
  } while( true );
  word_count_actual = word_count_actual + (lVar14 - local_1fe0);
  local_1fc0 = local_1fc0 + -1;
  if (local_1fc0 == 0) {
    fclose(__stream);
    free(__ptr);
    free(__ptr_00);
    pthread_exit((void *)0x0);
  }
  lVar14 = file_size / (long)num_threads;
  goto LAB_0010356d;
}

Assistant:

void *TrainModelThread(void *id) {
  long long a, b, d, cw, word, last_word, sentence_length = 0, sentence_position = 0;
  long long word_count = 0, last_word_count = 0, sen[MAX_SENTENCE_LENGTH + 1];
  long long l1, l2, c, target, label, local_iter = iter;
  unsigned long long next_random = (long long)id;
  real f, g;
  clock_t now;
  real *neu1 = (real *)calloc(layer1_size, sizeof(real));
  real *neu1e = (real *)calloc(layer1_size, sizeof(real));
    printf("Opening train file %s\n", train_file);
  FILE *fi = fopen(train_file, "rb");
  if (fi == NULL) {
    fprintf(stderr, "no such file or directory: %s", train_file);
    exit(1);
  }
  if (num_threads > 1) {
    fseek(fi, file_size / (long long)num_threads * (long long)id, SEEK_SET);
  }
  while (1) {
    if (word_count - last_word_count > 10000) {
      word_count_actual += word_count - last_word_count;
      last_word_count = word_count;
      if ((debug_mode > 1)) {
        now=clock();
        printf("%cAlpha: %f  Progress: %.2f%%  Words/thread/sec: %.2fk  ", 13, alpha,
         word_count_actual / (real)(iter * train_words + 1) * 100,
         word_count_actual / ((real)(now - start + 1) / (real)CLOCKS_PER_SEC * 1000));
        fflush(stdout);
      }
      alpha = starting_alpha * (1 - word_count_actual / (real)(iter * train_words + 1));
      if (alpha < starting_alpha * 0.0001) alpha = starting_alpha * 0.0001;
    }
    if (sentence_length == 0) {
      while (1) {
        word = ReadWordIndex(fi);
        if (feof(fi)) break;
        if (word == -1) continue;
        word_count++;
        if (word == 0) break;
        // The subsampling randomly discards frequent words while keeping the ranking same
        if (sample > 0) {
          real ran = (sqrt(vocab[word].cn / (sample * train_words)) + 1) * (sample * train_words) / vocab[word].cn;
          next_random = next_random * (unsigned long long)25214903917 + 11;
          if (ran < (next_random & 0xFFFF) / (real)65536) continue;
        }
        sen[sentence_length] = word;
        sentence_length++;
        if (sentence_length >= MAX_SENTENCE_LENGTH) break;
      }
      sentence_position = 0;
    }
    if (feof(fi) || (word_count > train_words / num_threads)) {
      word_count_actual += word_count - last_word_count;
      local_iter--;
      if (local_iter == 0) break;
      word_count = 0;
      last_word_count = 0;
      sentence_length = 0;
      fseek(fi, file_size / (long long)num_threads * (long long)id, SEEK_SET);
      continue;
    }
    word = sen[sentence_position];
    if (word == -1) continue;
    for (c = 0; c < layer1_size; c++) neu1[c] = 0;
    for (c = 0; c < layer1_size; c++) neu1e[c] = 0;
    next_random = next_random * (unsigned long long)25214903917 + 11;
    b = next_random % window;
    if (cbow) {  //train the cbow architecture
      // in -> hidden
      cw = 0;
      for (a = b; a < window * 2 + 1 - b; a++) if (a != window) {
        c = sentence_position - window + a;
        if (c < 0) continue;
        if (c >= sentence_length) continue;
        last_word = sen[c];
        if (last_word == -1) continue;
        for (c = 0; c < layer1_size; c++) neu1[c] += syn0[c + last_word * layer1_size];
        cw++;
      }
      if (cw) {
        for (c = 0; c < layer1_size; c++) neu1[c] /= cw;
        if (hs) for (d = 0; d < vocab[word].codelen; d++) {
          f = 0;
          l2 = vocab[word].point[d] * layer1_size;
          // Propagate hidden -> output
          for (c = 0; c < layer1_size; c++) f += neu1[c] * syn1[c + l2];
          if (f <= -MAX_EXP) continue;
          else if (f >= MAX_EXP) continue;
          else f = expTable[(int)((f + MAX_EXP) * (EXP_TABLE_SIZE / MAX_EXP / 2))];
          // 'g' is the gradient multiplied by the learning rate
          g = (1 - vocab[word].code[d] - f) * alpha;
          // Propagate errors output -> hidden
          for (c = 0; c < layer1_size; c++) neu1e[c] += g * syn1[c + l2];
          // Learn weights hidden -> output
          for (c = 0; c < layer1_size; c++) syn1[c + l2] += g * neu1[c];
        }
        // NEGATIVE SAMPLING
        if (negative > 0) for (d = 0; d < negative + 1; d++) {
          if (d == 0) {
            target = word;
            label = 1;
          } else {
            next_random = next_random * (unsigned long long)25214903917 + 11;
            target = table[(next_random >> 16) % table_size];
            if (target == 0) target = next_random % (vocab_size - 1) + 1;
            if (target == word) continue;
            label = 0;
          }
          l2 = target * layer1_size;
          f = 0;
          for (c = 0; c < layer1_size; c++) f += neu1[c] * syn1neg[c + l2];
          if (f > MAX_EXP) g = (label - 1) * alpha;
          else if (f < -MAX_EXP) g = (label - 0) * alpha;
          else g = (label - expTable[(int)((f + MAX_EXP) * (EXP_TABLE_SIZE / MAX_EXP / 2))]) * alpha;
          for (c = 0; c < layer1_size; c++) neu1e[c] += g * syn1neg[c + l2];
          for (c = 0; c < layer1_size; c++) syn1neg[c + l2] += g * neu1[c];
        }
        // hidden -> in
        for (a = b; a < window * 2 + 1 - b; a++) if (a != window) {
          c = sentence_position - window + a;
          if (c < 0) continue;
          if (c >= sentence_length) continue;
          last_word = sen[c];
          if (last_word == -1) continue;
          for (c = 0; c < layer1_size; c++) syn0[c + last_word * layer1_size] += neu1e[c];
        }
      }
    } else {  //train skip-gram
      for (a = b; a < window * 2 + 1 - b; a++) if (a != window) {
        c = sentence_position - window + a;
        if (c < 0) continue;
        if (c >= sentence_length) continue;
        last_word = sen[c];
        if (last_word == -1) continue;
        l1 = last_word * layer1_size;
        for (c = 0; c < layer1_size; c++) neu1e[c] = 0;
        // HIERARCHICAL SOFTMAX
        if (hs) for (d = 0; d < vocab[word].codelen; d++) {
          f = 0;
          l2 = vocab[word].point[d] * layer1_size;
          // Propagate hidden -> output
          for (c = 0; c < layer1_size; c++) f += syn0[c + l1] * syn1[c + l2];
          if (f <= -MAX_EXP) continue;
          else if (f >= MAX_EXP) continue;
          else f = expTable[(int)((f + MAX_EXP) * (EXP_TABLE_SIZE / MAX_EXP / 2))];
          // 'g' is the gradient multiplied by the learning rate
          g = (1 - vocab[word].code[d] - f) * alpha;
          // Propagate errors output -> hidden
          for (c = 0; c < layer1_size; c++) neu1e[c] += g * syn1[c + l2];
          // Learn weights hidden -> output
          for (c = 0; c < layer1_size; c++) syn1[c + l2] += g * syn0[c + l1];
        }
        // NEGATIVE SAMPLING
        if (negative > 0) for (d = 0; d < negative + 1; d++) {
          if (d == 0) {
            target = word;
            label = 1;
          } else {
            next_random = next_random * (unsigned long long)25214903917 + 11;
            target = table[(next_random >> 16) % table_size];
            if (target == 0) target = next_random % (vocab_size - 1) + 1;
            if (target == word) continue;
            label = 0;
          }
          l2 = target * layer1_size;
          f = 0;
          for (c = 0; c < layer1_size; c++) f += syn0[c + l1] * syn1neg[c + l2];
          if (f > MAX_EXP) g = (label - 1) * alpha;
          else if (f < -MAX_EXP) g = (label - 0) * alpha;
          else g = (label - expTable[(int)((f + MAX_EXP) * (EXP_TABLE_SIZE / MAX_EXP / 2))]) * alpha;
          for (c = 0; c < layer1_size; c++) neu1e[c] += g * syn1neg[c + l2];
          for (c = 0; c < layer1_size; c++) syn1neg[c + l2] += g * syn0[c + l1];
        }
        // Learn weights input -> hidden
        for (c = 0; c < layer1_size; c++) syn0[c + l1] += neu1e[c];
      }
    }
    sentence_position++;
    if (sentence_position >= sentence_length) {
      sentence_length = 0;
      continue;
    }
  }
  fclose(fi);
  free(neu1);
  free(neu1e);
  pthread_exit(NULL);
}